

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

double __thiscall
despot::RockSampleApproxParticleUpperBound::Value
          (RockSampleApproxParticleUpperBound *this,State *state)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  BaseRockSample *pBVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  Coord rock_pos;
  vector<bool,_std::allocator<bool>_> visited;
  allocator_type local_79;
  ulong local_78;
  double local_70;
  double local_68;
  double local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  uVar3 = Grid<int>::GetCoord(&this->rs_model_->grid_,
                              *(int *)(state + 0xc) >> ((byte)this->rs_model_->num_rocks_ & 0x1f));
  local_78 = local_78 & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)this->rs_model_->num_rocks_,(bool *)&local_78,&local_79);
  local_68 = 0.0;
  local_60 = 1.0;
  local_70 = -3.11261356879985e-322;
  do {
    iVar2 = this->rs_model_->size_;
    despot::Coord::Coord((Coord *)&local_78,-1,-1);
    pBVar4 = this->rs_model_;
    if (pBVar4->num_rocks_ < 1) {
      iVar1 = -1;
    }
    else {
      iVar2 = iVar2 * 2;
      uVar5 = 0xffffffff;
      uVar6 = 0;
      do {
        iVar1 = despot::Coord::ManhattanDistance
                          (uVar3,*(undefined8 *)
                                  ((pBVar4->rock_pos_).
                                   super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar6 * 8));
        if ((((*(uint *)(state + 0xc) >> ((uint)uVar6 & 0x1f) & 1) != 0) && (iVar1 < iVar2)) &&
           ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0)) {
          local_78 = *(ulong *)((this->rs_model_->rock_pos_).
                                super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar6 * 8);
          uVar5 = uVar6 & 0xffffffff;
          iVar2 = iVar1;
        }
        iVar1 = (int)uVar5;
        uVar6 = uVar6 + 1;
        pBVar4 = this->rs_model_;
      } while ((long)uVar6 < (long)pBVar4->num_rocks_);
    }
    if (iVar1 != -1) {
      iVar2 = despot::Coord::ManhattanDistance(local_78,uVar3);
      dVar7 = pow(_ParticleBelief,(double)iVar2);
      uVar5 = (ulong)iVar1;
      uVar3 = uVar5 + 0x3f;
      if (-1 < (long)uVar5) {
        uVar3 = uVar5;
      }
      local_60 = local_60 * dVar7;
      local_68 = local_68 + local_60 * 10.0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p
      [((long)uVar3 >> 6) + ((ulong)((uVar5 & (ulong)local_70) < 0x8000000000000001) - 1)] =
           local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar3 >> 6) + ((ulong)((uVar5 & (ulong)local_70) < 0x8000000000000001) - 1)] |
           1L << ((byte)iVar1 & 0x3f);
      uVar3 = local_78;
    }
  } while (iVar1 != -1);
  pBVar4 = this->rs_model_;
  local_70 = pow(_ParticleBelief,
                 (double)(pBVar4->size_ -
                         (*(int *)(state + 0xc) >> ((byte)pBVar4->num_rocks_ & 0x1f)) %
                         (pBVar4->grid_).xsize_));
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return local_60 * 10.0 * local_70 + local_68;
}

Assistant:

double Value(const State& state) const {
		double value = 0;
		double discount = 1.0;
		Coord rob_pos = rs_model_->GetRobPos(&state);
		vector<bool> visited(rs_model_->num_rocks_);
		while (true) {
			// Move to the nearest valuable rock and sample
			int shortest = 2 * rs_model_->size_;
			int id = -1;
			Coord rock_pos(-1, -1);
			for (int rock = 0; rock < rs_model_->num_rocks_; rock++) {
				int dist = Coord::ManhattanDistance(rob_pos,
					rs_model_->rock_pos_[rock]);
				if (CheckFlag(state.state_id, rock) && dist < shortest
					&& !visited[rock]) {
					shortest = dist;
					id = rock;
					rock_pos = rs_model_->rock_pos_[rock];
				}
			}

			if (id == -1)
				break;

			discount *= Globals::Discount(Coord::ManhattanDistance(rock_pos, rob_pos));
			value += discount * 10.0;
			visited[id] = true;
			rob_pos = rock_pos;
		}

		value += 10.0 * discount
			* Globals::Discount(rs_model_->size_ - rs_model_->GetX(&state));
		return value;
	}